

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O2

RTPTime __thiscall jrtplib::RTCPScheduler::CalculateBYETransmissionInterval(RTCPScheduler *this)

{
  RTPTime RVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  
  RVar1.m_t = 0.0;
  if ((this->byescheduled == true) && (this->sendbyenow == false)) {
    dVar3 = (this->schedparams).mininterval.m_t;
    if ((this->schedparams).usehalfatstartup != false) {
      dVar3 = dVar3 * 0.5;
    }
    dVar2 = ((((double)CONCAT44(0x45300000,(int)(this->avgbyepacketsize >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->avgbyepacketsize) - 4503599627370496.0)) /
            ((1.0 - (this->schedparams).senderfraction) * (this->schedparams).bandwidth)) *
            (double)this->byemembers;
    if (dVar3 <= dVar2) {
      dVar3 = dVar2;
    }
    (*this->rtprand->_vptr_RTPRandom[5])();
    RVar1.m_t = ((extraout_XMM0_Qa + 0.5) * dVar3) / 1.21828;
  }
  return (RTPTime)RVar1.m_t;
}

Assistant:

RTPTime RTCPScheduler::CalculateBYETransmissionInterval()
{
	if (!byescheduled)
		return RTPTime(0,0);
	
	if (sendbyenow)
		return RTPTime(0,0);
	
	double C,n;

	C = ((double)avgbyepacketsize)/((1.0-schedparams.GetSenderBandwidthFraction())*schedparams.GetRTCPBandwidth());
	n = (double)byemembers;
	
	RTPTime Tmin = schedparams.GetMinimumTransmissionInterval();
	double tmin = Tmin.GetDouble();
	
	if (schedparams.GetUseHalfAtStartup())
		tmin /= 2.0;

	double ntimesC = n*C;
	double Td = (tmin>ntimesC)?tmin:ntimesC;

	double mul = rtprand.GetRandomDouble()+0.5; // gives random value between 0.5 and 1.5
	double T = (Td*mul)/1.21828; // see RFC 3550 p 30
	
	return RTPTime(T);
}